

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void mp::internal::ReadNames<internal::NameHandler>
               (CStringRef filename,StringRef data,NameHandler *handler)

{
  StringRef name;
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  ReadError *in_RCX;
  CStringRef in_RDX;
  CStringRef in_RSI;
  int column;
  char *ptr;
  char *end;
  char *start;
  int line;
  bool in_win_newline;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  BasicCStringRef<char> local_68 [2];
  int local_54;
  BasicStringRef<char> local_50;
  char *local_40;
  char *local_38;
  char *local_30;
  int arg2;
  uint3 in_stack_ffffffffffffffdc;
  uint arg1;
  ReadError *pRVar4;
  
  arg1 = (uint)in_stack_ffffffffffffffdc;
  arg2 = 1;
  pcVar1 = fmt::BasicStringRef<char>::data((BasicStringRef<char> *)&stack0xffffffffffffffe8);
  local_30 = pcVar1;
  sVar2 = fmt::BasicStringRef<char>::size((BasicStringRef<char> *)&stack0xffffffffffffffe8);
  local_38 = pcVar1 + sVar2;
  for (local_40 = local_30; local_40 != local_38; local_40 = local_40 + 1) {
    if (*local_40 == '\r') {
      arg1 = CONCAT13(1,(int3)arg1);
    }
    pRVar4 = in_RCX;
    if (*local_40 == '\n') {
      fmt::BasicStringRef<char>::BasicStringRef
                (&local_50,local_30,
                 (size_t)(local_40 + (-(ulong)((byte)(arg1 >> 0x18) & 1) - (long)local_30)));
      name.size_ = (size_t)pcVar1;
      name.data_ = (char *)in_RCX;
      ::internal::NameHandler::OnName
                ((NameHandler *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),name);
      local_30 = local_40 + 1;
      arg2 = arg2 + 1;
      arg1 = arg1 & 0xffffff;
    }
    in_RCX = pRVar4;
  }
  if (local_30 != local_38) {
    local_54 = ((int)local_38 - (int)local_30) + 1;
    uVar3 = __cxa_allocate_exception(0x40);
    fmt::BasicCStringRef<char>::BasicCStringRef(local_68,"missing newline");
    ReadError::ReadError<>(in_RCX,in_RDX,arg1,arg2,in_RSI);
    __cxa_throw(uVar3,&ReadError::typeinfo,ReadError::~ReadError);
  }
  return;
}

Assistant:

void ReadNames(fmt::CStringRef filename, fmt::StringRef data,
               NameHandler &handler) {
  bool in_win_newline = false;
  int line = 1;
  const char *start = data.data();
  const char *end = start + data.size();
  for (const char *ptr = start; ptr != end; ++ptr) {
    if (*ptr == '\r') in_win_newline = true;
    if (*ptr == '\n') {
      handler.OnName(fmt::StringRef(start, ptr - start - in_win_newline));
      start = ptr + 1;
      ++line;
      in_win_newline = false;
    }
  }
  if (start != end) {
    int column = static_cast<int>(end - start + 1);
    throw ReadError(filename, line, column, "missing newline");
  }
}